

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-fight-attack.c
# Opt level: O0

wchar_t borg_attack_aux_rest(void)

{
  bool bVar1;
  _Bool _Var2;
  wchar_t wVar3;
  borg_kill *pbVar4;
  char *what;
  int local_40;
  int local_3c;
  int local_38;
  wchar_t d;
  wchar_t ay;
  wchar_t ax;
  wchar_t y9;
  wchar_t x9;
  borg_kill *kill;
  wchar_t my_danger;
  wchar_t wStack_c;
  _Bool resting_is_good;
  wchar_t i;
  
  bVar1 = false;
  wVar3 = borg_danger(borg.c.y,borg.c.x,L'\x01',false,false);
  for (my_danger = L'\x01'; my_danger < borg_kills_nxt; my_danger = my_danger + L'\x01') {
    pbVar4 = borg_kills + my_danger;
    local_38 = (pbVar4->pos).x;
    local_3c = (pbVar4->pos).y;
    if ((pbVar4->r_idx != 0) && ((int)(uint)pbVar4->r_idx < (int)(z_info->r_max - 1))) {
      if (borg.c.x < local_38) {
        local_38 = local_38 - borg.c.x;
      }
      else {
        local_38 = borg.c.x - local_38;
      }
      if (borg.c.y < local_3c) {
        local_3c = local_3c - borg.c.y;
      }
      else {
        local_3c = borg.c.y - local_3c;
      }
      if (local_38 < local_3c) {
        local_40 = local_3c;
      }
      else {
        local_40 = local_38;
      }
      if ((((((local_40 == 2) && (pbVar4->ranged_attack == '\0')) && ((pbVar4->awake & 1U) != 0)) &&
           (((int)borg_t - (int)pbVar4->when < 0xb &&
            (_Var2 = flag_has_dbg(r_info[pbVar4->r_idx].flags,0xb,0x15,"r_info[kill->r_idx].flags",
                                  "RF_NEVER_MOVE"), !_Var2)))) &&
          (((int)((uint)pbVar4->speed - borg.trait[0x2c]) < 5 &&
           ((borg.goal.type == 1 && ((uint)borg_flow_y[0] == (pbVar4->pos).y)))))) &&
         ((_Var2 = borg_los(borg.c.y,borg.c.x,(pbVar4->pos).y,(pbVar4->pos).x), _Var2 &&
          (wVar3 <= borg.trait[0x1b])))) {
        bVar1 = true;
      }
    }
  }
  if (bVar1) {
    if ((borg_simulate & 1U) == 0) {
      borg_keypress(0x2c);
      what = format("# Resting on grid (%d, %d), waiting for monster to approach.",
                    (ulong)(uint)borg.c.y,(ulong)(uint)borg.c.x);
      borg_note(what);
      wStack_c = L'\x01';
    }
    else {
      wStack_c = L'\x01';
    }
  }
  else {
    wStack_c = L'\0';
  }
  return wStack_c;
}

Assistant:

static int borg_attack_aux_rest(void)
{
    int  i;
    bool resting_is_good = false;

    int my_danger        = borg_danger(borg.c.y, borg.c.x, 1, false, false);

    /* Examine all the monsters */
    for (i = 1; i < borg_kills_nxt; i++) {
        borg_kill *kill = &borg_kills[i];

        int x9          = kill->pos.x;
        int y9          = kill->pos.y;
        int ax, ay, d;

        /* Skip dead monsters */
        if (!kill->r_idx)
            continue;

        /* "player ghosts" */
        if (kill->r_idx >= z_info->r_max - 1)
            continue;

        /* Distance components */
        ax = (x9 > borg.c.x) ? (x9 - borg.c.x) : (borg.c.x - x9);
        ay = (y9 > borg.c.y) ? (y9 - borg.c.y) : (borg.c.y - y9);

        /* Distance */
        d = MAX(ax, ay);

        /* Minimal and maximal distance */
        if (d != 2)
            continue;

        /* Ranged Attacks, don't rest. */
        if (kill->ranged_attack)
            continue;

        /* Skip the sleeping ones */
        if (!kill->awake)
            continue;

        /* need to have seen it recently */
        if (borg_t - kill->when > 10)
            continue;

        /* Skip monsters that dont chase */
        if (rf_has(r_info[kill->r_idx].flags, RF_NEVER_MOVE))
            continue;

        /* Monster better not be faster than me */
        if (kill->speed - borg.trait[BI_SPEED] >= 5)
            continue;

        /* Should be flowing towards the monster */
        if (borg.goal.type != GOAL_KILL || borg_flow_y[0] != kill->pos.y)
            continue;

        /* Cant have an obstacle between us */
        if (!borg_los(borg.c.y, borg.c.x, kill->pos.y, kill->pos.x))
            continue;

        /* Might be a little dangerous to just wait here */
        if (my_danger > borg.trait[BI_CURHP])
            continue;

        /* Should be a good idea to wait for monster here. */
        resting_is_good = true;
    }

    /* Not a good idea */
    if (resting_is_good == false)
        return 0;

    /* Return some value for this rest */
    if (borg_simulate)
        return 1;

    /* Rest */
    borg_keypress(',');
    borg_note(
        format("# Resting on grid (%d, %d), waiting for monster to approach.",
            borg.c.y, borg.c.x));

    /* All done */
    return 1;
}